

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::texcoord2d>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *result)

{
  pointer ptVar1;
  StreamReader *pSVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  texcoord2d *ptVar6;
  char *pcVar7;
  undefined1 local_61;
  texcoord2d value;
  texcoord2d value_1;
  
  ptVar1 = (result->
           super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>)
      ._M_impl.super__Vector_impl_data._M_finish != ptVar1) {
    (result->
    super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>).
    _M_impl.super__Vector_impl_data._M_finish = ptVar1;
  }
  bVar3 = SkipWhitespaceAndNewline(this,true);
  if (bVar3) {
    bVar3 = ReadBasicType(this,&value);
    if (bVar3) {
      ::std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
      push_back(result,&value);
      do {
        bVar3 = Eof(this);
        if (bVar3) goto LAB_00309e8d;
        bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = Char1(this,(char *)&value);
        if (!bVar3) {
          return false;
        }
        if (value.s._0_1_ == sep) {
          bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          bVar3 = LookChar1(this,(char *)&value_1);
          if (!bVar3) {
            return false;
          }
          iVar4 = 3;
          if (value_1.s._0_1_ != end_symbol) goto LAB_00309df5;
        }
        else {
LAB_00309df5:
          if (value.s._0_1_ != sep) {
            pSVar2 = this->_sr;
            if ((0 < (long)pSVar2->idx_) && (uVar5 = pSVar2->idx_ - 1, uVar5 <= pSVar2->length_)) {
              pSVar2->idx_ = uVar5;
            }
            goto LAB_00309e8d;
          }
          bVar3 = SkipWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          bVar3 = ReadBasicType(this,&value_1);
          iVar4 = 3;
          if (bVar3) {
            ::std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
            ::push_back(result,&value_1);
            iVar4 = 0;
          }
        }
      } while (iVar4 == 0);
      if (iVar4 == 1) {
        return false;
      }
LAB_00309e8d:
      if ((result->
          super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar7 = "Empty array.\n";
      ptVar6 = &value;
    }
    else {
      pcVar7 = "Not starting with the value of requested type.\n";
      ptVar6 = (texcoord2d *)&local_61;
    }
    ::std::__cxx11::string::string((string *)&value_1,pcVar7,(allocator *)ptVar6);
    PushError(this,(string *)&value_1);
    ::std::__cxx11::string::_M_dispose();
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}